

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

string __thiscall
mjs::anon_unknown_35::do_replace
          (anon_unknown_35 *this,string *str,value *match_val,value *replace_value)

{
  gc_heap_ptr_untyped *pgVar1;
  undefined8 *puVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  string sVar4;
  object_ptr match;
  wstring res;
  wstring_view local_b8 [2];
  gc_heap_ptr_untyped local_98;
  string match_str;
  wstring s;
  value match_index_val;
  
  if (match_val->type_ == object) {
    pgVar1 = &value::object_value(match_val)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&match.super_gc_heap_ptr_untyped,pgVar1);
    match_index_val._0_16_ = string::view(str);
    std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
              ((wstring *)&s,
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&match_index_val,
               (allocator<wchar_t> *)&res);
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&match.super_gc_heap_ptr_untyped);
    res._M_dataplus._M_p = (pointer)0x5;
    res._M_string_length = (size_type)anon_var_dwarf_1578ae;
    (**(code **)*puVar2)(&match_index_val,puVar2);
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&match.super_gc_heap_ptr_untyped);
    local_b8[0]._M_str = L"0";
    local_b8[0]._M_len = 1;
    (**(code **)*puVar2)(&res,puVar2);
    pgVar1 = (gc_heap_ptr_untyped *)value::string_value((value *)&res);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&match_str,pgVar1);
    value::~value((value *)&res);
    value::number_value(&match_index_val);
    string::view(&match_str);
    res._M_dataplus._M_p = (pointer)&res.field_2;
    res._M_string_length = 0;
    res.field_2._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::substr((ulong)local_b8,(ulong)&s);
    std::__cxx11::wstring::operator=((wstring *)&res,(wstring *)local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_b8);
    do_get_replacement_string((anon_unknown_35 *)&local_98,str,&match,replace_value);
    local_b8[0] = string::view((string *)&local_98);
    std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
              ((wstring *)&res,local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
    std::__cxx11::wstring::substr((ulong)local_b8,(ulong)&s);
    std::__cxx11::wstring::append((wstring *)&res);
    std::__cxx11::wstring::~wstring((wstring *)local_b8);
    local_b8[0]._M_str = res._M_dataplus._M_p;
    local_b8[0]._M_len = res._M_string_length;
    string::string((string *)this,match.super_gc_heap_ptr_untyped.heap_,local_b8);
    std::__cxx11::wstring::~wstring((wstring *)&res);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&match_str);
    value::~value(&match_index_val);
    std::__cxx11::wstring::~wstring((wstring *)&s);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&match.super_gc_heap_ptr_untyped);
    uVar3 = extraout_RDX_00;
  }
  else {
    if (match_val->type_ != null) {
      __assert_fail("match_val.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                    ,0x163,
                    "string mjs::(anonymous namespace)::do_replace(const string &, const value &, const value &)"
                   );
    }
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,(gc_heap_ptr_untyped *)str)
    ;
    uVar3 = extraout_RDX;
  }
  sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar3;
  sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar4.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string do_replace(const string& str, const value& match_val, const value& replace_value) {
    if (match_val.type() == value_type::null) {
        return str;
    }
    assert(match_val.type() == value_type::object);
    const auto match           = match_val.object_value();
    const auto s               = std::wstring{str.view()};
    const auto match_index_val = match->get(L"index");
    const auto match_str       = match->get(L"0").string_value();
    const auto match_index     = static_cast<uint32_t>(match_index_val.number_value());
    const auto match_length    = static_cast<uint32_t>(match_str.view().length());

    auto& h = match.heap();

    std::wstring res;
    res = s.substr(0, match_index);
    res += do_get_replacement_string(str, match, replace_value).view();
    res += s.substr(match_index + match_length);
    return string{h, res};
}